

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O0

int xio_setoption(XIO_HANDLE xio,char *optionName,void *value)

{
  int iVar1;
  OPTIONHANDLER_RESULT OVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l;
  XIO_INSTANCE *xio_instance;
  int result;
  void *value_local;
  char *optionName_local;
  XIO_HANDLE xio_local;
  
  if ((xio == (XIO_HANDLE)0x0) || (optionName == (char *)0x0)) {
    xio_instance._4_4_ = 0xaf;
  }
  else {
    iVar1 = strcmp(CONCRETE_OPTIONS,optionName);
    if (iVar1 == 0) {
      OVar2 = OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value,xio->concrete_xio_handle);
      if (OVar2 == OPTIONHANDLER_OK) {
        xio_instance._4_4_ = 0;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/xio.c"
                    ,"xio_setoption",0xba,1,"unable to OptionHandler_FeedOptions");
        }
        xio_instance._4_4_ = 0xbb;
      }
    }
    else {
      xio_instance._4_4_ =
           (*xio->io_interface_description->concrete_io_setoption)
                     (xio->concrete_xio_handle,optionName,value);
    }
  }
  return xio_instance._4_4_;
}

Assistant:

int xio_setoption(XIO_HANDLE xio, const char* optionName, const void* value)
{
    int result;

    /* Codes_SRS_XIO_03_030: [If the xio argument or the optionName argument is NULL, xio_setoption shall return a non-zero value.] */
    if (xio == NULL || optionName == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        XIO_INSTANCE* xio_instance = (XIO_INSTANCE*)xio;

        if (strcmp(CONCRETE_OPTIONS, optionName) == 0)
        {
            /*then value is a pointer to OPTIONHANDLER_HANDLE*/
            if (OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value, xio_instance->concrete_xio_handle) != OPTIONHANDLER_OK)
            {
                LogError("unable to OptionHandler_FeedOptions");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        else /*passthrough*/
        {
            /* Codes_SRS_XIO_003_028: [xio_setoption shall pass the optionName and value to the concrete IO implementation specified in xio_create by invoking the concrete_xio_setoption function.] */
            /* Codes_SRS_XIO_03_029: [xio_setoption shall return 0 upon success.] */
            /* Codes_SRS_XIO_03_031: [If the underlying concrete_xio_setoption fails, xio_setOption shall return a non-zero value.] */
            result = xio_instance->io_interface_description->concrete_io_setoption(xio_instance->concrete_xio_handle, optionName, value);
        }
    }

    return result;
}